

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::listing(ostream *lst_file)

{
  undefined8 *puVar1;
  size_t i;
  ulong uVar2;
  
  std::operator<<(lst_file,"Sections\n");
  ostream_printf(lst_file,"%-8s%-16s%-10s%s\n","Index","Name","Address","Size");
  for (uVar2 = 0; uVar2 < (ulong)(DAT_0013caa8 - table >> 3); uVar2 = uVar2 + 1) {
    puVar1 = *(undefined8 **)(table + uVar2 * 8);
    ostream_printf(lst_file,"%-8d%-16s%04X      %04X %d\n",uVar2,*puVar1,
                   (ulong)*(uint *)((long)puVar1 + 0x24),(ulong)*(uint *)(puVar1 + 6),
                   *(uint *)(puVar1 + 6));
  }
  return;
}

Assistant:

void Sections::listing(std::ostream& lst_file)
{
	lst_file << "Sections\n";
	ostream_printf(lst_file, "%-8s%-16s%-10s%s\n", "Index", "Name", "Address", "Size");
	for (size_t i = 0; i < table.size(); ++i) {
		ostream_printf(lst_file, "%-8d%-16s%04X      %04X %d\n", i,
				table[i]->name.c_str(), table[i]->base_address,
				table[i]->content_size, table[i]->content_size);
	}
}